

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_test.cpp
# Opt level: O0

void __thiscall
GenericExceptionCatcher_Tests::generic_catcher_with_custom_action::test_method
          (generic_catcher_with_custom_action *this)

{
  undefined1 in_R9B;
  undefined1 local_191;
  undefined1 *local_190;
  undefined1 local_188 [8];
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:130:80)>
  stdExceptionCatcher;
  undefined1 local_39;
  undefined1 *local_38;
  undefined1 local_30 [8];
  GenericExceptionHandler<void,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:114:61)>
  allCatcher;
  int hit;
  generic_catcher_with_custom_action *this_local;
  
  allCatcher._20_4_ = 0;
  local_38 = &allCatcher.field_0x14;
  mittens::
  generic_handler<void,GenericExceptionCatcher_Tests::generic_catcher_with_custom_action::test_method()::__0,mittens::UnHandler<int>>
            ((GenericExceptionHandler<void,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:114:61)>
              *)local_30,(mittens *)0x1,(FailCodeType)local_38,
             (anon_class_8_1_ba1d4ef3_for_customAction_)&local_39,(UnHandler<int> *)0x1,(bool)in_R9B
            );
  throw_int(0);
  local_190 = &allCatcher.field_0x14;
  mittens::
  generic_handler<std::exception,GenericExceptionCatcher_Tests::generic_catcher_with_custom_action::test_method()::__1,mittens::UnHandler<int>>
            ((GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:130:80)>
              *)local_188,(mittens *)0x1,(FailCodeType)local_190,
             (anon_class_8_1_ba1d4ef3_for_customAction_)&local_191,(UnHandler<int> *)0x1,
             (bool)in_R9B);
  throw_std_exception();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(generic_catcher_with_custom_action)
{
   int hit=0;
   {
      auto allCatcher = generic_handler<void>(EXIT_FAILURE, [&hit](){ ++hit; }, UnHandler<>());
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(0,hit);
            BOOST_CHECK_EQUAL(EXIT_FAILURE, allCatcher.handleException());
            BOOST_CHECK_EQUAL(1,hit);
         }
      }
   }

   {
      auto stdExceptionCatcher = generic_handler<std::exception>(EXIT_FAILURE, [&hit](std::exception&){ ++hit; }, UnHandler<>());
      {
         try
         {
            throw_std_exception();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(1,hit);
            BOOST_CHECK_EQUAL(EXIT_FAILURE, stdExceptionCatcher.handleException());
            BOOST_CHECK_EQUAL(2,hit);
         }
      }
   }
}